

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O3

void mi_buffered_out(char *msg,void *arg)

{
  ulong uVar1;
  char c;
  char cVar2;
  buffered_t *buf;
  char *pcVar3;
  
  if ((arg != (void *)0x0 && msg != (char *)0x0) && (cVar2 = *msg, cVar2 != '\0')) {
    pcVar3 = msg + 1;
    do {
      uVar1 = *(ulong *)((long)arg + 0x18);
      if (*(ulong *)((long)arg + 0x20) <= uVar1) {
        *(undefined1 *)(*(long *)((long)arg + 0x10) + uVar1) = 0;
        _mi_fputs(*arg,*(void **)((long)arg + 8),(char *)0x0,*(char **)((long)arg + 0x10));
        uVar1 = 0;
      }
      *(ulong *)((long)arg + 0x18) = uVar1 + 1;
      *(char *)(*(long *)((long)arg + 0x10) + uVar1) = cVar2;
      if (cVar2 == '\n') {
        *(undefined1 *)(*(long *)((long)arg + 0x10) + *(long *)((long)arg + 0x18)) = 0;
        _mi_fputs(*arg,*(void **)((long)arg + 8),(char *)0x0,*(char **)((long)arg + 0x10));
        *(undefined8 *)((long)arg + 0x18) = 0;
      }
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
  }
  return;
}

Assistant:

static void mi_cdecl mi_buffered_out(const char* msg, void* arg) {
  buffered_t* buf = (buffered_t*)arg;
  if (msg==NULL || buf==NULL) return;
  for (const char* src = msg; *src != 0; src++) {
    char c = *src;
    if (buf->used >= buf->count) mi_buffered_flush(buf);
    mi_assert_internal(buf->used < buf->count);
    buf->buf[buf->used++] = c;
    if (c == '\n') mi_buffered_flush(buf);
  }
}